

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::$_3>>
::Visit<google::protobuf::FileDescriptorProto_const>
          (VisitImpl<google::protobuf::internal::VisitorImpl<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__3>>
           *this,FileDescriptor *descriptor,FileDescriptorProto *proto)

{
  int iVar1;
  Descriptor *descriptor_00;
  DescriptorProto *proto_00;
  EnumDescriptor *descriptor_01;
  EnumDescriptorProto *proto_01;
  FieldDescriptor *descriptor_02;
  FieldDescriptorProto *proto_02;
  ServiceDescriptor *descriptor_03;
  ServiceDescriptorProto *proto_03;
  undefined4 local_30;
  undefined4 local_2c;
  int i_3;
  int i_2;
  int i_1;
  int i;
  FileDescriptorProto *proto_local;
  FileDescriptor *descriptor_local;
  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:6533:27)>_>
  *this_local;
  
  DescriptorBuilder::
  BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)
  ::$_3::operator()(this,descriptor,proto);
  i_2 = 0;
  while( true ) {
    iVar1 = FileDescriptor::message_type_count(descriptor);
    if (iVar1 <= i_2) break;
    descriptor_00 = FileDescriptor::message_type(descriptor,i_2);
    proto_00 = VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc:6533:27)>_>
               ::message_type((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:6533:27)>_>
                               *)this,proto,i_2);
    Visit<google::protobuf::DescriptorProto_const>(this,descriptor_00,proto_00);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = FileDescriptor::enum_type_count(descriptor);
    if (iVar1 <= i_3) break;
    descriptor_01 = FileDescriptor::enum_type(descriptor,i_3);
    proto_01 = VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc:6533:27)>_>
               ::enum_type((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:6533:27)>_>
                            *)this,proto,i_3);
    Visit<google::protobuf::EnumDescriptorProto_const>(this,descriptor_01,proto_01);
    i_3 = i_3 + 1;
  }
  local_2c = 0;
  while( true ) {
    iVar1 = FileDescriptor::extension_count(descriptor);
    if (iVar1 <= local_2c) break;
    descriptor_02 = FileDescriptor::extension(descriptor,local_2c);
    proto_02 = VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc:6533:27)>_>
               ::extension((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:6533:27)>_>
                            *)this,proto,local_2c);
    Visit<google::protobuf::FieldDescriptorProto_const>(this,descriptor_02,proto_02);
    local_2c = local_2c + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar1 = FileDescriptor::service_count(descriptor);
    if (iVar1 <= local_30) break;
    descriptor_03 = FileDescriptor::service(descriptor,local_30);
    proto_03 = VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.cc:6533:27)>_>
               ::service((VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_protocolbuffers[P]protobuf_src_google_protobuf_descriptor_cc:6533:27)>_>
                          *)this,proto,local_30);
    Visit<google::protobuf::ServiceDescriptorProto_const>(this,descriptor_03,proto_03);
    local_30 = local_30 + 1;
  }
  return;
}

Assistant:

void Visit(const FileDescriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);
    for (int i = 0; i < descriptor.message_type_count(); i++) {
      Visit(*descriptor.message_type(i), message_type(proto, i)...);
    }
    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }
    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }
    for (int i = 0; i < descriptor.service_count(); i++) {
      Visit(*descriptor.service(i), service(proto, i)...);
    }
  }